

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_compile.c
# Opt level: O0

BOOL is_startline(PCRE2_SPTR8 code,uint bracket_map,compile_block_8 *cb,int atomcount,BOOL inassert)

{
  BOOL BVar1;
  byte *pbVar2;
  uint local_50;
  uint new_map;
  int n;
  int op;
  PCRE2_SPTR8 scode;
  BOOL inassert_local;
  int atomcount_local;
  compile_block_8 *cb_local;
  byte *pbStack_18;
  uint bracket_map_local;
  PCRE2_SPTR8 code_local;
  
  pbStack_18 = code;
  do {
    _n = first_significant_code
                   (pbStack_18 +
                    (int)(uint)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x03\x03\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x01\x01\x01\x01\x01\x01\x05\x05\x01\x01\x01\x05!!"
                               [*pbStack_18],0);
    new_map = (uint)*_n;
    if (new_map == 0x8b) {
      pbVar2 = _n + 3;
      if (*pbVar2 == 0x76) {
        pbVar2 = _n + 9;
      }
      else if (*pbVar2 == 0x77) {
        pbVar2 = pbVar2 + CONCAT11(_n[8],_n[9]);
      }
      _n = pbVar2;
      if ((*_n - 0x91 < 6) || (*_n == 0xa3)) {
        return 0;
      }
      BVar1 = is_startline(_n,bracket_map,cb,atomcount,1);
      if (BVar1 == 0) {
        return 0;
      }
      do {
        _n = _n + CONCAT11(_n[1],_n[2]);
      } while (*_n == 0x78);
      _n = first_significant_code(_n + 3,0);
      new_map = (uint)*_n;
    }
    if ((((new_map == 0x87) || (new_map == 0x88)) || (new_map == 0x8c)) || (new_map == 0x8d)) {
      BVar1 = is_startline(_n,bracket_map,cb,atomcount,inassert);
      if (BVar1 == 0) {
        return 0;
      }
    }
    else if (((new_map == 0x89) || (new_map == 0x8a)) || ((new_map == 0x8e || (new_map == 0x8f)))) {
      if (CONCAT11(_n[3],_n[4]) < 0x20) {
        local_50 = 1 << (_n[4] & 0x1f);
      }
      else {
        local_50 = 1;
      }
      BVar1 = is_startline(_n,bracket_map | local_50,cb,atomcount,inassert);
      if (BVar1 == 0) {
        return 0;
      }
    }
    else if ((new_map == 0x7f) || (new_map == 0x83)) {
      BVar1 = is_startline(_n,bracket_map,cb,atomcount,1);
      if (BVar1 == 0) {
        return 0;
      }
    }
    else if (new_map == 0x85) {
      BVar1 = is_startline(_n,bracket_map,cb,atomcount + 1,inassert);
      if (BVar1 == 0) {
        return 0;
      }
    }
    else if (((new_map == 0x55) || (new_map == 0x56)) || (new_map == 0x5e)) {
      if ((((_n[1] != 0xc) || ((bracket_map & cb->backref_map) != 0)) ||
          ((0 < atomcount || ((cb->had_pruneorskip != 0 || (inassert != 0)))))) ||
         ((cb->external_options & 0x8000) != 0)) {
        return 0;
      }
    }
    else if ((new_map != 0x1b) && (new_map != 0x1c)) {
      return 0;
    }
    pbStack_18 = pbStack_18 + CONCAT11(pbStack_18[1],pbStack_18[2]);
    if (*pbStack_18 != 0x78) {
      return 1;
    }
  } while( true );
}

Assistant:

static BOOL
is_startline(PCRE2_SPTR code, unsigned int bracket_map, compile_block *cb,
  int atomcount, BOOL inassert)
{
do {
   PCRE2_SPTR scode = first_significant_code(
     code + PRIV(OP_lengths)[*code], FALSE);
   int op = *scode;

   /* If we are at the start of a conditional assertion group, *both* the
   conditional assertion *and* what follows the condition must satisfy the test
   for start of line. Other kinds of condition fail. Note that there may be an
   auto-callout at the start of a condition. */

   if (op == OP_COND)
     {
     scode += 1 + LINK_SIZE;

     if (*scode == OP_CALLOUT) scode += PRIV(OP_lengths)[OP_CALLOUT];
       else if (*scode == OP_CALLOUT_STR) scode += GET(scode, 1 + 2*LINK_SIZE);

     switch (*scode)
       {
       case OP_CREF:
       case OP_DNCREF:
       case OP_RREF:
       case OP_DNRREF:
       case OP_FAIL:
       case OP_FALSE:
       case OP_TRUE:
       return FALSE;

       default:     /* Assertion */
       if (!is_startline(scode, bracket_map, cb, atomcount, TRUE)) return FALSE;
       do scode += GET(scode, 1); while (*scode == OP_ALT);
       scode += 1 + LINK_SIZE;
       break;
       }
     scode = first_significant_code(scode, FALSE);
     op = *scode;
     }

   /* Non-capturing brackets */

   if (op == OP_BRA  || op == OP_BRAPOS ||
       op == OP_SBRA || op == OP_SBRAPOS)
     {
     if (!is_startline(scode, bracket_map, cb, atomcount, inassert))
       return FALSE;
     }

   /* Capturing brackets */

   else if (op == OP_CBRA  || op == OP_CBRAPOS ||
            op == OP_SCBRA || op == OP_SCBRAPOS)
     {
     int n = GET2(scode, 1+LINK_SIZE);
     unsigned int new_map = bracket_map | ((n < 32)? (1u << n) : 1);
     if (!is_startline(scode, new_map, cb, atomcount, inassert)) return FALSE;
     }

   /* Positive forward assertions */

   else if (op == OP_ASSERT || op == OP_ASSERT_NA)
     {
     if (!is_startline(scode, bracket_map, cb, atomcount, TRUE))
       return FALSE;
     }

   /* Atomic brackets */

   else if (op == OP_ONCE)
     {
     if (!is_startline(scode, bracket_map, cb, atomcount + 1, inassert))
       return FALSE;
     }

   /* .* means "start at start or after \n" if it isn't in atomic brackets or
   brackets that may be referenced or an assertion, and as long as the pattern
   does not contain *PRUNE or *SKIP, because these break the feature. Consider,
   for example, /.*?a(*PRUNE)b/ with the subject "aab", which matches "ab",
   i.e. not at the start of a line. There is also an option that disables this
   optimization. */

   else if (op == OP_TYPESTAR || op == OP_TYPEMINSTAR || op == OP_TYPEPOSSTAR)
     {
     if (scode[1] != OP_ANY || (bracket_map & cb->backref_map) != 0 ||
         atomcount > 0 || cb->had_pruneorskip || inassert ||
         (cb->external_options & PCRE2_NO_DOTSTAR_ANCHOR) != 0)
       return FALSE;
     }

   /* Check for explicit circumflex; anything else gives a FALSE result. Note
   in particular that this includes atomic brackets OP_ONCE because the number
   of characters matched by .* cannot be adjusted inside them. */

   else if (op != OP_CIRC && op != OP_CIRCM) return FALSE;

   /* Move on to the next alternative */

   code += GET(code, 1);
   }
while (*code == OP_ALT);  /* Loop for each alternative */
return TRUE;
}